

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Geometry.cpp
# Opt level: O0

void __thiscall Assimp::AMFImporter::ParseNode_Triangle(AMFImporter *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint32_t uVar4;
  CAMFImporter_NodeElement_Triangle *this_00;
  DeadlyImportError *this_01;
  byte local_499;
  allocator<char> local_3a1;
  string local_3a0;
  allocator<char> local_379;
  string local_378;
  allocator<char> local_351;
  string local_350;
  allocator<char> local_329;
  string local_328;
  allocator<char> local_301;
  string local_300;
  allocator<char> local_2d9;
  string local_2d8;
  allocator<char> local_2b1;
  string local_2b0;
  allocator<char> local_289;
  string local_288;
  allocator<char> local_261;
  string local_260;
  allocator<char> local_239;
  string local_238;
  allocator<char> local_211;
  string local_210;
  allocator<char> local_1e9;
  string local_1e8;
  allocator<char> local_1c1;
  string local_1c0;
  allocator<char> local_199;
  string local_198;
  allocator<char> local_171;
  string local_170;
  allocator<char> local_149;
  string local_148;
  allocator<char> local_121;
  string local_120;
  allocator<char> local_f9;
  string local_f8;
  allocator<char> local_d1;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_59;
  string local_58;
  byte local_36;
  byte local_35;
  byte local_34;
  byte local_33;
  byte local_32;
  byte local_31;
  bool close_found;
  bool read_flag [3];
  bool tex_read;
  CAMFImporter_NodeElement_Triangle *pCStack_30;
  bool col_read;
  CAMFImporter_NodeElement_Triangle *als;
  CAMFImporter_NodeElement_Triangle *local_18;
  CAMFImporter_NodeElement *ne;
  AMFImporter *this_local;
  
  ne = (CAMFImporter_NodeElement *)this;
  this_00 = (CAMFImporter_NodeElement_Triangle *)operator_new(0x68);
  CAMFImporter_NodeElement_Triangle::CAMFImporter_NodeElement_Triangle
            (this_00,this->mNodeElement_Cur);
  pCStack_30 = this_00;
  local_18 = this_00;
  uVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((uVar2 & 1) == 0) {
    local_31 = 0;
    local_32 = 0;
    memset(&local_35,0,3);
    ParseHelper_Node_Enter(this,&local_18->super_CAMFImporter_NodeElement);
    local_36 = 0;
    do {
      do {
        while( true ) {
          uVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
          if ((uVar2 & 1) == 0) goto LAB_00582128;
          iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
          if (iVar3 != 1) break;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"color",&local_59);
          bVar1 = XML_CheckNode_NameEqual(this,&local_58);
          std::__cxx11::string::~string((string *)&local_58);
          std::allocator<char>::~allocator(&local_59);
          if (bVar1) {
            if ((local_31 & 1) != 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_80,"color",&local_81);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_a8,"Only one color can be defined for <triangle>.",
                         &local_a9);
              Throw_MoreThanOnceDefined(this,&local_80,&local_a8);
              std::__cxx11::string::~string((string *)&local_a8);
              std::allocator<char>::~allocator(&local_a9);
              std::__cxx11::string::~string((string *)&local_80);
              std::allocator<char>::~allocator(&local_81);
            }
            ParseNode_Color(this);
            local_31 = 1;
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_d0,"texmap",&local_d1);
            bVar1 = XML_CheckNode_NameEqual(this,&local_d0);
            std::__cxx11::string::~string((string *)&local_d0);
            std::allocator<char>::~allocator(&local_d1);
            if (bVar1) {
              if ((local_32 & 1) != 0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_f8,"texmap",&local_f9);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_120,
                           "Only one texture coordinate can be defined for <triangle>.",&local_121);
                Throw_MoreThanOnceDefined(this,&local_f8,&local_120);
                std::__cxx11::string::~string((string *)&local_120);
                std::allocator<char>::~allocator(&local_121);
                std::__cxx11::string::~string((string *)&local_f8);
                std::allocator<char>::~allocator(&local_f9);
              }
              ParseNode_TexMap(this,false);
              local_32 = 1;
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_148,"map",&local_149);
              bVar1 = XML_CheckNode_NameEqual(this,&local_148);
              std::__cxx11::string::~string((string *)&local_148);
              std::allocator<char>::~allocator(&local_149);
              if (bVar1) {
                if ((local_32 & 1) != 0) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_170,"map",&local_171);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_198,
                             "Only one texture coordinate can be defined for <triangle>.",&local_199
                            );
                  Throw_MoreThanOnceDefined(this,&local_170,&local_198);
                  std::__cxx11::string::~string((string *)&local_198);
                  std::allocator<char>::~allocator(&local_199);
                  std::__cxx11::string::~string((string *)&local_170);
                  std::allocator<char>::~allocator(&local_171);
                }
                ParseNode_TexMap(this,true);
                local_32 = 1;
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1c0,"v1",&local_1c1);
                bVar1 = XML_CheckNode_NameEqual(this,&local_1c0);
                std::__cxx11::string::~string((string *)&local_1c0);
                std::allocator<char>::~allocator(&local_1c1);
                if (bVar1) {
                  if ((local_35 & 1) != 0) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_1e8,"v1",&local_1e9);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_210,"Only one component can be defined.",&local_211)
                    ;
                    Throw_MoreThanOnceDefined(this,&local_1e8,&local_210);
                    std::__cxx11::string::~string((string *)&local_210);
                    std::allocator<char>::~allocator(&local_211);
                    std::__cxx11::string::~string((string *)&local_1e8);
                    std::allocator<char>::~allocator(&local_1e9);
                  }
                  uVar4 = XML_ReadNode_GetVal_AsU32(this);
                  pCStack_30->V[0] = (ulong)uVar4;
                  local_35 = 1;
                }
                else {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_238,"v2",&local_239);
                  bVar1 = XML_CheckNode_NameEqual(this,&local_238);
                  std::__cxx11::string::~string((string *)&local_238);
                  std::allocator<char>::~allocator(&local_239);
                  if (bVar1) {
                    if ((local_34 & 1) != 0) {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_260,"v2",&local_261);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_288,"Only one component can be defined.",
                                 &local_289);
                      Throw_MoreThanOnceDefined(this,&local_260,&local_288);
                      std::__cxx11::string::~string((string *)&local_288);
                      std::allocator<char>::~allocator(&local_289);
                      std::__cxx11::string::~string((string *)&local_260);
                      std::allocator<char>::~allocator(&local_261);
                    }
                    uVar4 = XML_ReadNode_GetVal_AsU32(this);
                    pCStack_30->V[1] = (ulong)uVar4;
                    local_34 = 1;
                  }
                  else {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_2b0,"v3",&local_2b1);
                    bVar1 = XML_CheckNode_NameEqual(this,&local_2b0);
                    std::__cxx11::string::~string((string *)&local_2b0);
                    std::allocator<char>::~allocator(&local_2b1);
                    if (bVar1) {
                      if ((local_33 & 1) != 0) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_2d8,"v3",&local_2d9);
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_300,"Only one component can be defined.",
                                   &local_301);
                        Throw_MoreThanOnceDefined(this,&local_2d8,&local_300);
                        std::__cxx11::string::~string((string *)&local_300);
                        std::allocator<char>::~allocator(&local_301);
                        std::__cxx11::string::~string((string *)&local_2d8);
                        std::allocator<char>::~allocator(&local_2d9);
                      }
                      uVar4 = XML_ReadNode_GetVal_AsU32(this);
                      pCStack_30->V[2] = (ulong)uVar4;
                      local_33 = 1;
                    }
                    else {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_328,"triangle",&local_329);
                      XML_CheckNode_SkipUnsupported(this,&local_328);
                      std::__cxx11::string::~string((string *)&local_328);
                      std::allocator<char>::~allocator(&local_329);
                    }
                  }
                }
              }
            }
          }
        }
        iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      } while (iVar3 != 2);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_350,"triangle",&local_351)
      ;
      bVar1 = XML_CheckNode_NameEqual(this,&local_350);
      std::__cxx11::string::~string((string *)&local_350);
      std::allocator<char>::~allocator(&local_351);
    } while (!bVar1);
    local_36 = 1;
LAB_00582128:
    if ((local_36 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_378,"triangle",&local_379)
      ;
      Throw_CloseNotFound(this,&local_378);
      std::__cxx11::string::~string((string *)&local_378);
      std::allocator<char>::~allocator(&local_379);
    }
    ParseHelper_Node_Exit(this);
    local_499 = 0;
    if (((local_35 & 1) != 0) && (local_499 = 0, (local_34 & 1) != 0)) {
      local_499 = local_33;
    }
    if ((local_499 & 1) == 0) {
      this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3a0,"Not all vertices of the triangle are defined.",&local_3a1);
      DeadlyImportError::DeadlyImportError(this_01,&local_3a0);
      __cxa_throw(this_01,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
  }
  else {
    std::__cxx11::list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::
    push_back(&this->mNodeElement_Cur->Child,(value_type *)&local_18);
  }
  std::__cxx11::list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::
  push_back(&this->mNodeElement_List,(value_type *)&local_18);
  return;
}

Assistant:

void AMFImporter::ParseNode_Triangle()
{
CAMFImporter_NodeElement* ne;

	// create new color object.
	ne = new CAMFImporter_NodeElement_Triangle(mNodeElement_Cur);

	CAMFImporter_NodeElement_Triangle& als = *((CAMFImporter_NodeElement_Triangle*)ne);// alias for convenience

	// Check for child nodes
	if(!mReader->isEmptyElement())
	{
		bool col_read = false, tex_read = false;
		bool read_flag[3] = { false, false, false };

		ParseHelper_Node_Enter(ne);
		MACRO_NODECHECK_LOOPBEGIN("triangle");
			if(XML_CheckNode_NameEqual("color"))
			{
				// Check if data already defined.
				if(col_read) Throw_MoreThanOnceDefined("color", "Only one color can be defined for <triangle>.");
				// read data and set flag about it
				ParseNode_Color();
				col_read = true;

				continue;
			}

			if(XML_CheckNode_NameEqual("texmap"))// new name of node: "texmap".
			{
				// Check if data already defined.
				if(tex_read) Throw_MoreThanOnceDefined("texmap", "Only one texture coordinate can be defined for <triangle>.");
				// read data and set flag about it
				ParseNode_TexMap();
				tex_read = true;

				continue;
			}
			else if(XML_CheckNode_NameEqual("map"))// old name of node: "map".
			{
				// Check if data already defined.
				if(tex_read) Throw_MoreThanOnceDefined("map", "Only one texture coordinate can be defined for <triangle>.");
				// read data and set flag about it
				ParseNode_TexMap(true);
				tex_read = true;

				continue;
			}

			MACRO_NODECHECK_READCOMP_U32("v1", read_flag[0], als.V[0]);
			MACRO_NODECHECK_READCOMP_U32("v2", read_flag[1], als.V[1]);
			MACRO_NODECHECK_READCOMP_U32("v3", read_flag[2], als.V[2]);
		MACRO_NODECHECK_LOOPEND("triangle");
		ParseHelper_Node_Exit();
		// check that all components was defined
		if((read_flag[0] && read_flag[1] && read_flag[2]) == 0) throw DeadlyImportError("Not all vertices of the triangle are defined.");

	}// if(!mReader->isEmptyElement())
	else
	{
		mNodeElement_Cur->Child.push_back(ne);// Add element to child list of current element
	}// if(!mReader->isEmptyElement()) else

	mNodeElement_List.push_back(ne);// and to node element list because its a new object in graph.
}